

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall kj::Path::parse(Path *__return_storage_ptr__,Path *this,StringPtr path)

{
  Fault firstElement;
  Exception *pEVar1;
  long lVar2;
  size_t sVar3;
  size_t capacity;
  StringPtr path_00;
  DebugExpression<bool> _kjCondition;
  StringPtr path_local;
  Fault f;
  
  path_local.content.size_ = (size_t)path.content.ptr;
  path_local.content.ptr = (char *)this;
  if ((char *)path_local.content.size_ == (char *)0x1) {
    _kjCondition.value = true;
  }
  else {
    _kjCondition.value = *(char *)&(this->parts).ptr != '/';
    if (!_kjCondition.value) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x39,FAILED,"!path.startsWith(\"/\")",
                 "_kjCondition,\"expected a relative path, got absolute\", path",&_kjCondition,
                 (char (*) [39])"expected a relative path, got absolute",&path_local);
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  if (path_local.content.ptr + (path_local.content.size_ - 1) == path_local.content.ptr) {
    capacity = 1;
  }
  else {
    capacity = 1;
    lVar2 = 0;
    do {
      capacity = capacity + (path_local.content.ptr[lVar2] == '/');
      lVar2 = lVar2 + 1;
    } while (path_local.content.size_ - 1 != lVar2);
  }
  sVar3 = 0;
  pEVar1 = (Exception *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  path_00.content.size_ = sVar3;
  path_00.content.ptr = (char *)path_local.content.size_;
  f.exception = pEVar1;
  evalImpl(__return_storage_ptr__,(Path *)&f,(Vector<kj::String> *)path_local.content.ptr,path_00);
  firstElement.exception = f.exception;
  if (f.exception != (Exception *)0x0) {
    f.exception = (Exception *)0x0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement.exception,0x18,
               ((long)pEVar1 - (long)firstElement.exception >> 3) * -0x5555555555555555,
               ((long)((long)pEVar1 + (capacity * 0x18 - (long)firstElement.exception)) >> 3) *
               -0x5555555555555555,ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::parse(StringPtr path) {
  KJ_REQUIRE(!path.startsWith("/"), "expected a relative path, got absolute", path) {
    // When exceptions are disabled, go on -- the leading '/' will end up ignored.
    break;
  }
  return evalImpl(Vector<String>(countParts(path)), path);
}